

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

printfArg * BuildArgArray(TidyDocImpl *doc,ctmbstr fmt,__va_list_tag *ap,int *rv)

{
  uint uVar1;
  int iVar2;
  ctmbstr ptVar3;
  TidyOptionValue *local_d0;
  TidyOptionValue *local_b0;
  undefined4 *local_98;
  undefined4 *local_80;
  printfArg *nas;
  char *pcStack_48;
  char c;
  char *p;
  int pos;
  int i;
  int cn;
  int number;
  int *rv_local;
  __va_list_tag *ap_local;
  ctmbstr fmt_local;
  TidyDocImpl *doc_local;
  
  i = 0;
  pos = -1;
  *rv = 0;
  ptVar3 = fmt;
  while( true ) {
    pcStack_48 = ptVar3;
    if (*pcStack_48 == '\0') break;
    ptVar3 = pcStack_48 + 1;
    if ((*pcStack_48 == '%') && (ptVar3 = pcStack_48 + 2, pcStack_48[1] != '%')) {
      i = i + 1;
    }
  }
  if (i == 0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    doc_local = (TidyDocImpl *)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)i * 0x30);
    if (doc_local == (TidyDocImpl *)0x0) {
      *rv = -1;
      doc_local = (TidyDocImpl *)0x0;
    }
    else {
      for (p._4_4_ = 0; ptVar3 = fmt, p._4_4_ < i; p._4_4_ = p._4_4_ + 1) {
        *(undefined4 *)((doc_local->config).value + (long)p._4_4_ * 6 + -0xe) = 0x14;
      }
      do {
        do {
          do {
            pcStack_48 = ptVar3;
            ptVar3 = pcStack_48 + 1;
            if (*pcStack_48 == '\0') goto LAB_001437bd;
          } while (*pcStack_48 != '%');
          pcStack_48 = pcStack_48 + 2;
          nas._7_1_ = *ptVar3;
          ptVar3 = pcStack_48;
        } while (nas._7_1_ == '%');
        iVar2 = ((int)pcStack_48 - (int)fmt) + -2;
        if (nas._7_1_ == '*') {
          *rv = -1;
          goto LAB_001437bd;
        }
        while ('/' < nas._7_1_ && nas._7_1_ < ':') {
          nas._7_1_ = *pcStack_48;
          pcStack_48 = pcStack_48 + 1;
        }
        if (nas._7_1_ == '.') {
          nas._7_1_ = *pcStack_48;
          if (nas._7_1_ == '*') {
            *rv = -1;
            goto LAB_001437bd;
          }
          while (pcStack_48 = pcStack_48 + 1, '/' < nas._7_1_ && nas._7_1_ < ':') {
            nas._7_1_ = *pcStack_48;
          }
        }
        pos = pos + 1;
        *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -0xe) = 1;
        switch(nas._7_1_) {
        case 'E':
        case 'F':
        case 'G':
        case 'e':
        case 'f':
        case 'g':
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -0xe) = 3;
          uVar1 = ap->fp_offset;
          if (uVar1 < 0xa1) {
            local_d0 = (TidyOptionValue *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->fp_offset = uVar1 + 0x10;
          }
          else {
            local_d0 = (TidyOptionValue *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_d0 + 1;
          }
          (doc_local->config).value[(long)pos * 6 + -9] = *local_d0;
          break;
        default:
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -0xe) = 0x14;
          *rv = -1;
          break;
        case 'X':
        case 'c':
        case 'o':
        case 'u':
        case 'x':
          uVar1 = ap->gp_offset;
          if (uVar1 < 0x29) {
            local_80 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            local_80 = (undefined4 *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_80 + 2;
          }
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -9) = *local_80;
          break;
        case 'd':
        case 'i':
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -0xe) = 0;
          uVar1 = ap->gp_offset;
          if (uVar1 < 0x29) {
            local_98 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            local_98 = (undefined4 *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_98 + 2;
          }
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -9) = *local_98;
          break;
        case 's':
          *(undefined4 *)((doc_local->config).value + (long)pos * 6 + -0xe) = 2;
          uVar1 = ap->gp_offset;
          if (uVar1 < 0x29) {
            local_b0 = (TidyOptionValue *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            local_b0 = (TidyOptionValue *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_b0 + 1;
          }
          (doc_local->config).value[(long)pos * 6 + -9] = *local_b0;
        }
        *(int *)((long)(doc_local->config).value + (long)pos * 0x30 + -0x6c) = iVar2;
        *(int *)((doc_local->config).value + (long)pos * 6 + -0xd) =
             ((int)pcStack_48 - (int)fmt) - iVar2;
        if (0x14 < *(int *)((doc_local->config).value + (long)pos * 6 + -0xd)) {
          *rv = -1;
          goto LAB_001437bd;
        }
        strncpy((char *)((long)(doc_local->config).value + (long)pos * 0x30 + -100),
                fmt + *(int *)((long)(doc_local->config).value + (long)pos * 0x30 + -0x6c),
                (long)*(int *)((doc_local->config).value + (long)pos * 6 + -0xd));
        *(undefined1 *)
         ((long)(doc_local->config).value +
         (long)*(int *)((doc_local->config).value + (long)pos * 6 + -0xd) + (long)pos * 0x30 + -100)
             = 0;
        ptVar3 = pcStack_48;
      } while (*(int *)((doc_local->config).value + (long)pos * 6 + -0xe) != 0x14);
      *rv = -1;
LAB_001437bd:
      if (*rv < 0) {
        (*doc->allocator->vtbl->free)(doc->allocator,doc_local);
        doc_local = (TidyDocImpl *)0x0;
      }
      else {
        *rv = i;
      }
    }
  }
  return (printfArg *)doc_local;
}

Assistant:

static struct printfArg* BuildArgArray( TidyDocImpl *doc, ctmbstr fmt, va_list ap, int* rv )
{
    int number = 0; /* the quantity of valid arguments found; returned as rv. */
    int cn = -1;    /* keeps track of which parameter index is current. */
    int i = 0;      /* typical index. */
    int pos = -1;   /* starting position of current argument. */
    const char* p;  /* current position in format string. */
    char c;         /* current character. */
    struct printfArg* nas;
    
    /* first pass: determine number of valid % to allocate space. */
    
    p = fmt;
    *rv = 0;
    
    while( ( c = *p++ ) != 0 )
    {
        if( c != '%' )
            continue;
        
        if( ( c = *p++ ) == '%' )	/* skip %% case */
            continue;
        else
            number++;
    }
        

    if( number == 0 )
        return NULL;

    
    nas = (struct printfArg*)TidyDocAlloc( doc, number * sizeof( struct printfArg ) );
    if( !nas )
    {
        *rv = -1;
        return NULL;
    }


    for( i = 0; i < number; i++ )
    {
        nas[i].type = tidyFormatType_UNKNOWN;
    }
    
    
    /* second pass: set nas[].type and location. */
    
    p = fmt;
    while( ( c = *p++ ) != 0 )
    {
        if( c != '%' )
            continue;
        
        if( ( c = *p++ ) == '%' )
            continue; /* skip %% case */

        pos = p - fmt - 2; /* p already incremented twice */

        /* width -- width via parameter */
        if (c == '*')
        {
            /* not supported feature */
            *rv = -1;
            break;
        }
        
        /* width field -- skip */
        while ((c >= '0') && (c <= '9'))
        {
            c = *p++;
        }
        
        /* precision */
        if (c == '.')
        {
            c = *p++;
            if (c == '*') {
                /* not supported feature */
                *rv = -1;
                break;
            }
            
            while ((c >= '0') && (c <= '9'))
            {
                c = *p++;
            }
        }
        
        
        cn++;
        
        /* size and format */
        nas[cn].type = tidyFormatType_UINT;
        switch (c)
        {
            case 'c': /* unsigned int (char) */
            case 'u': /* unsigned int */
            case 'X': /* unsigned int as hex */
            case 'x': /* unsigned int as hex */
            case 'o': /* octal */
                nas[cn].u.ui = va_arg( ap, unsigned int );
                break;

            case 'd': /* signed int */
            case 'i': /* signed int */
                nas[cn].type = tidyFormatType_INT;
                nas[cn].u.i = va_arg( ap, int );
                break;


            case 's': /* string */
                nas[cn].type = tidyFormatType_STRING;
                nas[cn].u.s = va_arg( ap, char* );
                break;

            case 'e': /* double */
            case 'E': /* double */
            case 'f': /* double */
            case 'F': /* double */
            case 'g': /* double */
            case 'G': /* double */
                nas[cn].type = tidyFormatType_DOUBLE;
                nas[cn].u.d = va_arg( ap, double );
                break;

            default:
                nas[cn].type = tidyFormatType_UNKNOWN;
                *rv = -1;
                break;
        }

        /* position and format */
        nas[cn].formatStart = pos;
        nas[cn].formatLength = (p - fmt) - pos;
        
        /* the format string exceeds the buffer length */
        if ( nas[cn].formatLength >= FORMAT_LENGTH )
        {
            *rv = -1;
            break;
        }
        else
        {
            strncpy(nas[cn].format, fmt + nas[cn].formatStart, nas[cn].formatLength);
            nas[cn].format[nas[cn].formatLength] = 0; /* Is. #800 - If count <= srcLen, no 0 added! */
        }
        

        /* Something's not right. */
        if( nas[cn].type == tidyFormatType_UNKNOWN )
        {
            *rv = -1;
            break;
        }
    }
    
    
    /* third pass: fill the nas[cn].ap */
    
    if( *rv < 0 )
    {
        TidyDocFree( doc, nas );;
        return NULL;
    }

    *rv = number;
    return nas;
}